

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<int,_ft::allocator<int>_>::deque
          (deque<int,_ft::allocator<int>_> *this,allocator_type *alloc)

{
  (this->m_start)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_00110cc8;
  (this->m_finish)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_00110cc8;
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  dequeInit(this,0);
  return;
}

Assistant:

explicit deque(allocator_type const & alloc = allocator_type()):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(alloc) {
		this->dequeInit(0);
	}